

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O2

void Ivy_ManHaigCreateObj(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  ulong uVar4;
  Ivy_Obj_t *pIVar5;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                  ,0xba,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pObj & 1) == 0) {
    uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
    if (uVar1 == 4) {
      pIVar2 = Ivy_ObjChild0Equiv(pObj);
      pIVar3 = Ivy_HaigObjRepr((Ivy_Obj_t *)((ulong)pIVar2 & 0xfffffffffffffffe));
      pIVar2 = Ivy_Latch(p->pHaig,(Ivy_Obj_t *)((ulong)((uint)pIVar2 & 1) ^ (ulong)pIVar3),
                         *(uint *)&pObj->field_0x8 >> 9 & IVY_INIT_DC);
    }
    else if (uVar1 == 5) {
      pIVar2 = Ivy_ObjChild0Equiv(pObj);
      pIVar3 = Ivy_HaigObjRepr((Ivy_Obj_t *)((ulong)pIVar2 & 0xfffffffffffffffe));
      uVar4 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar4 + 0x48);
      }
      pIVar5 = Ivy_HaigObjRepr((Ivy_Obj_t *)(uVar4 & 0xfffffffffffffffe));
      pIVar2 = Ivy_And(p->pHaig,(Ivy_Obj_t *)((ulong)((uint)pIVar2 & 1) ^ (ulong)pIVar3),
                       (Ivy_Obj_t *)((ulong)((uint)uVar4 & 1) ^ (ulong)pIVar5));
    }
    else {
      if (uVar1 != 7) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                      ,0xce,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
      }
      pIVar2 = Ivy_ObjChild0Equiv(pObj);
    }
    pObj->pEquiv = pIVar2;
    return;
  }
  __assert_fail("!Ivy_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                ,0xbb,"void Ivy_ManHaigCreateObj(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_ManHaigCreateObj( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pEquiv0, * pEquiv1;
    assert( p->pHaig != NULL );
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjType(pObj) == IVY_BUF )
        pObj->pEquiv = Ivy_ObjChild0Equiv(pObj);
    else if ( Ivy_ObjType(pObj) == IVY_LATCH )
    {
//        pObj->pEquiv = Ivy_Latch( p->pHaig, Ivy_ObjChild0Equiv(pObj), pObj->Init );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pObj->pEquiv = Ivy_Latch( p->pHaig, pEquiv0, (Ivy_Init_t)pObj->Init );
    }
    else if ( Ivy_ObjType(pObj) == IVY_AND )
    {
//        pObj->pEquiv = Ivy_And( p->pHaig, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        pEquiv0 = Ivy_ObjChild0Equiv(pObj);
        pEquiv0 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv0)), Ivy_IsComplement(pEquiv0) );
        pEquiv1 = Ivy_ObjChild1Equiv(pObj);
        pEquiv1 = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pEquiv1)), Ivy_IsComplement(pEquiv1) );
        pObj->pEquiv = Ivy_And( p->pHaig, pEquiv0, pEquiv1 );
    }
    else assert( 0 );
    // make sure the node points to the representative
//    pObj->pEquiv = Ivy_NotCond( Ivy_HaigObjRepr(Ivy_Regular(pObj->pEquiv)), Ivy_IsComplement(pObj->pEquiv) );
}